

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

void luaL_addvalue(luaL_Buffer *B)

{
  lua_State *L;
  size_t in_RAX;
  char *__src;
  char *__dest;
  size_t len;
  size_t local_28;
  
  L = B->L;
  local_28 = in_RAX;
  __src = lua_tolstring(L,-1,&local_28);
  __dest = prepbuffsize(B,local_28,-2);
  memcpy(__dest,__src,local_28);
  B->n = B->n + local_28;
  lua_settop(L,-2);
  return;
}

Assistant:

LUALIB_API void luaL_addvalue (luaL_Buffer *B) {
  lua_State *L = B->L;
  size_t len;
  const char *s = lua_tolstring(L, -1, &len);
  char *b = prepbuffsize(B, len, -2);
  memcpy(b, s, len * sizeof(char));
  luaL_addsize(B, len);
  lua_pop(L, 1);  /* pop string */
}